

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessProgramPipelinesTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::ProgramPipelines::ErrorsTest::iterate(ErrorsTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ContextType ctxType;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  GLuint program_pipeline_dsa;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    (**(code **)(CONCAT44(extraout_var,iVar3) + 0x3d0))(0xffffffff);
    iVar3 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
    if (iVar3 != 0x501) {
      local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,
                 "CreateProgramPipelines has not generated INVALID_VALUE error when callded with negative number of objects to be created."
                 ,0x78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Instead, ",9);
      local_1b8.m_getName = glu::getErrorName;
      local_1b8.m_value = iVar3;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," error value was generated.",0x1b);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_130);
    }
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (iVar3 != 0x501) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ErrorsTest::iterate()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	glw::GLuint program_pipeline_dsa = 0;

	try
	{
		/* Check direct state creation. */
		gl.createProgramPipelines(-1, &program_pipeline_dsa);

		glw::GLenum error = GL_NO_ERROR;

		if (GL_INVALID_VALUE != (error = gl.getError()))
		{
			is_ok = false;

			/* Log. */
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "CreateProgramPipelines has not generated INVALID_VALUE error when callded "
											"with negative number of objects to be created."
				<< "Instead, " << glu::getErrorStr(error) << " error value was generated." << tcu::TestLog::EndMessage;
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (program_pipeline_dsa)
	{
		gl.deleteProgramPipelines(1, &program_pipeline_dsa);

		program_pipeline_dsa = 0;
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}